

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,string *base58_data,ByteData256 *tweak_sum)

{
  pointer puVar1;
  ByteData local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(&this->chaincode_);
  Pubkey::Pubkey(&this->pubkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AnalyzeBip32KeyData((void *)0x0,base58_data,&data,&this->version_,&this->depth_,&this->child_num_,
                      &this->chaincode_,(Privkey *)0x0,&this->pubkey_,&this->fingerprint_);
  ByteData::ByteData(&local_68,&data);
  puVar1 = (this->serialize_data_).data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->serialize_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->tweak_sum_,
             &tweak_sum->data_);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    const std::string& base58_data, const ByteData256& tweak_sum) {
  std::vector<uint8_t> data;
  AnalyzeBip32KeyData(
      nullptr, &base58_data, &data, &version_, &depth_, &child_num_,
      &chaincode_, nullptr, &pubkey_, &fingerprint_);
  serialize_data_ = ByteData(data);
  tweak_sum_ = tweak_sum;
}